

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_strand_array.h
# Opt level: O3

void __thiscall
embree::sse2::HeuristicStrandSplit::split
          (HeuristicStrandSplit *this,Split *split,PrimInfoRange *set,PrimInfoRange *lset,
          PrimInfoRange *rset)

{
  Geometry *pGVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  PrimRef *pPVar11;
  PrimRef *pPVar12;
  unsigned_long uVar13;
  float fVar20;
  float fVar21;
  float fVar22;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  float fVar23;
  undefined1 auVar25 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  undefined1 local_68 [16];
  PrimRef *local_50;
  unsigned_long local_48;
  unsigned_long local_40;
  PrimInfoRange *local_38;
  undefined1 auVar24 [16];
  
  if (INFINITY <= split->sah) {
    deterministic_order(this,&set->super_range<unsigned_long>);
    splitFallback(this,&set->super_range<unsigned_long>,lset,rset);
    return;
  }
  local_48 = (set->super_range<unsigned_long>)._begin;
  local_40 = (set->super_range<unsigned_long>)._end;
  local_50 = this->prims;
  pPVar12 = local_50 + local_48;
  pPVar11 = local_50 + local_40;
  local_98._8_8_ = 0x7f8000007f800000;
  local_98._0_8_ = 0x7f8000007f800000;
  local_b8._8_8_ = 0xff800000ff800000;
  local_b8._0_8_ = 0xff800000ff800000;
  local_c8._8_8_ = 0x7f8000007f800000;
  local_c8._0_8_ = 0x7f8000007f800000;
  local_d8._8_8_ = 0xff800000ff800000;
  local_d8._0_8_ = 0xff800000ff800000;
  local_a8._8_8_ = 0x7f8000007f800000;
  local_a8._0_8_ = 0x7f8000007f800000;
  local_e8._8_8_ = 0x7f8000007f800000;
  local_e8._0_8_ = 0x7f8000007f800000;
  local_88._8_8_ = 0xff800000ff800000;
  local_88._0_8_ = 0xff800000ff800000;
  local_f8._8_8_ = 0xff800000ff800000;
  local_f8._0_8_ = 0xff800000ff800000;
  local_38 = rset;
  do {
    pPVar11 = pPVar11 + -1;
    for (; pPVar12 <= pPVar11; pPVar12 = pPVar12 + 1) {
      pGVar1 = (this->scene->geometries).items[(uint)(pPVar12->lower).field_0.m128[3]].ptr;
      (*(pGVar1->super_RefCount)._vptr_RefCount[0x37])
                (&local_78,pGVar1,(ulong)(uint)(pPVar12->upper).field_0.m128[3]);
      fVar20 = fStack_74 * fStack_74;
      fVar21 = fStack_70 * fStack_70;
      fVar22 = fStack_6c * fStack_6c;
      fVar23 = fVar20 + local_78 * local_78 + fVar21;
      auVar24._0_8_ = CONCAT44(fVar20 + fVar20 + fVar22,fVar23);
      auVar24._8_4_ = fVar20 + fVar21 + fVar21;
      auVar24._12_4_ = fVar20 + fVar22 + fVar22;
      auVar14._8_4_ = auVar24._8_4_;
      auVar14._0_8_ = auVar24._0_8_;
      auVar14._12_4_ = auVar24._12_4_;
      auVar14 = rsqrtss(auVar14,auVar24);
      fVar20 = auVar14._0_4_;
      fVar20 = fVar20 * fVar20 * fVar23 * -0.5 * fVar20 + fVar20 * 1.5;
      if (ABS((split->axis0).field_0.m128[2] * fVar20 * fStack_70 +
              (split->axis0).field_0.m128[1] * fVar20 * fStack_74 +
              (split->axis0).field_0.m128[0] * fVar20 * local_78) <=
          ABS(fVar20 * fStack_70 * (split->axis1).field_0.m128[2] +
              fVar20 * fStack_74 * (split->axis1).field_0.m128[1] +
              fVar20 * local_78 * (split->axis1).field_0.m128[0])) break;
      pGVar1 = (this->scene->geometries).items[(uint)(pPVar12->lower).field_0.m128[3]].ptr;
      (*(pGVar1->super_RefCount)._vptr_RefCount[0x39])
                (&local_78,pGVar1,(ulong)(uint)(pPVar12->upper).field_0.m128[3]);
      auVar7._4_4_ = fStack_74;
      auVar7._0_4_ = local_78;
      auVar7._8_4_ = fStack_70;
      auVar7._12_4_ = fStack_6c;
      local_a8 = minps(local_a8,auVar7);
      local_d8 = maxps(local_d8,local_68);
      auVar15._0_4_ = local_78 + local_68._0_4_;
      auVar15._4_4_ = fStack_74 + local_68._4_4_;
      auVar15._8_4_ = fStack_70 + local_68._8_4_;
      auVar15._12_4_ = fStack_6c + local_68._12_4_;
      local_e8 = minps(local_e8,auVar15);
      local_f8 = maxps(local_f8,auVar15);
    }
    while( true ) {
      if (pPVar11 < pPVar12) {
        uVar13 = (long)pPVar12 - (long)local_50 >> 5;
        *(undefined8 *)&(lset->super_CentGeomBBox3fa).geomBounds.lower.field_0 = local_a8._0_8_;
        *(undefined8 *)((long)&(lset->super_CentGeomBBox3fa).geomBounds.lower.field_0 + 8) =
             local_a8._8_8_;
        *(undefined8 *)&(lset->super_CentGeomBBox3fa).geomBounds.upper.field_0 = local_d8._0_8_;
        *(undefined8 *)((long)&(lset->super_CentGeomBBox3fa).geomBounds.upper.field_0 + 8) =
             local_d8._8_8_;
        *(undefined8 *)&(lset->super_CentGeomBBox3fa).centBounds.lower.field_0 = local_e8._0_8_;
        *(undefined8 *)((long)&(lset->super_CentGeomBBox3fa).centBounds.lower.field_0 + 8) =
             local_e8._8_8_;
        *(undefined8 *)&(lset->super_CentGeomBBox3fa).centBounds.upper.field_0 = local_f8._0_8_;
        *(undefined8 *)((long)&(lset->super_CentGeomBBox3fa).centBounds.upper.field_0 + 8) =
             local_f8._8_8_;
        (lset->super_range<unsigned_long>)._begin = local_48;
        (lset->super_range<unsigned_long>)._end = uVar13;
        *(undefined8 *)&(local_38->super_CentGeomBBox3fa).geomBounds.lower.field_0 = local_c8._0_8_;
        *(undefined8 *)((long)&(local_38->super_CentGeomBBox3fa).geomBounds.lower.field_0 + 8) =
             local_c8._8_8_;
        *(undefined8 *)&(local_38->super_CentGeomBBox3fa).geomBounds.upper.field_0 = local_b8._0_8_;
        *(undefined8 *)((long)&(local_38->super_CentGeomBBox3fa).geomBounds.upper.field_0 + 8) =
             local_b8._8_8_;
        *(undefined8 *)&(local_38->super_CentGeomBBox3fa).centBounds.lower.field_0 = local_98._0_8_;
        *(undefined8 *)((long)&(local_38->super_CentGeomBBox3fa).centBounds.lower.field_0 + 8) =
             local_98._8_8_;
        *(undefined8 *)&(local_38->super_CentGeomBBox3fa).centBounds.upper.field_0 = local_88._0_8_;
        *(undefined8 *)((long)&(local_38->super_CentGeomBBox3fa).centBounds.upper.field_0 + 8) =
             local_88._8_8_;
        (local_38->super_range<unsigned_long>)._begin = uVar13;
        (local_38->super_range<unsigned_long>)._end = local_40;
        return;
      }
      pGVar1 = (this->scene->geometries).items[(uint)(pPVar11->lower).field_0.m128[3]].ptr;
      (*(pGVar1->super_RefCount)._vptr_RefCount[0x37])
                (&local_78,pGVar1,(ulong)(uint)(pPVar11->upper).field_0.m128[3]);
      fVar20 = fStack_74 * fStack_74;
      fVar21 = fStack_70 * fStack_70;
      fVar22 = fStack_6c * fStack_6c;
      fVar23 = fVar20 + local_78 * local_78 + fVar21;
      auVar25._0_8_ = CONCAT44(fVar20 + fVar20 + fVar22,fVar23);
      auVar25._8_4_ = fVar20 + fVar21 + fVar21;
      auVar25._12_4_ = fVar20 + fVar22 + fVar22;
      auVar17._8_4_ = auVar25._8_4_;
      auVar17._0_8_ = auVar25._0_8_;
      auVar17._12_4_ = auVar25._12_4_;
      auVar14 = rsqrtss(auVar17,auVar25);
      fVar20 = auVar14._0_4_;
      fVar20 = fVar20 * fVar20 * fVar23 * -0.5 * fVar20 + fVar20 * 1.5;
      if (ABS(fVar20 * fStack_70 * (split->axis1).field_0.m128[2] +
              fVar20 * fStack_74 * (split->axis1).field_0.m128[1] +
              fVar20 * local_78 * (split->axis1).field_0.m128[0]) <
          ABS((split->axis0).field_0.m128[2] * fVar20 * fStack_70 +
              (split->axis0).field_0.m128[1] * fVar20 * fStack_74 +
              (split->axis0).field_0.m128[0] * fVar20 * local_78)) break;
      pGVar1 = (this->scene->geometries).items[(uint)(pPVar11->lower).field_0.m128[3]].ptr;
      (*(pGVar1->super_RefCount)._vptr_RefCount[0x39])
                (&local_78,pGVar1,(ulong)(uint)(pPVar11->upper).field_0.m128[3]);
      auVar8._4_4_ = fStack_74;
      auVar8._0_4_ = local_78;
      auVar8._8_4_ = fStack_70;
      auVar8._12_4_ = fStack_6c;
      local_c8 = minps(local_c8,auVar8);
      local_b8 = maxps(local_b8,local_68);
      auVar16._0_4_ = local_78 + local_68._0_4_;
      auVar16._4_4_ = fStack_74 + local_68._4_4_;
      auVar16._8_4_ = fStack_70 + local_68._8_4_;
      auVar16._12_4_ = fStack_6c + local_68._12_4_;
      local_98 = minps(local_98,auVar16);
      local_88 = maxps(local_88,auVar16);
      pPVar11 = pPVar11 + -1;
    }
    pGVar1 = (this->scene->geometries).items[(uint)(pPVar11->lower).field_0.m128[3]].ptr;
    (*(pGVar1->super_RefCount)._vptr_RefCount[0x39])
              (&local_78,pGVar1,(ulong)(uint)(pPVar11->upper).field_0.m128[3]);
    auVar9._4_4_ = fStack_74;
    auVar9._0_4_ = local_78;
    auVar9._8_4_ = fStack_70;
    auVar9._12_4_ = fStack_6c;
    local_a8 = minps(local_a8,auVar9);
    local_d8 = maxps(local_d8,local_68);
    auVar18._0_4_ = local_78 + local_68._0_4_;
    auVar18._4_4_ = fStack_74 + local_68._4_4_;
    auVar18._8_4_ = fStack_70 + local_68._8_4_;
    auVar18._12_4_ = fStack_6c + local_68._12_4_;
    local_e8 = minps(local_e8,auVar18);
    local_f8 = maxps(local_f8,auVar18);
    pGVar1 = (this->scene->geometries).items[(uint)(pPVar12->lower).field_0.m128[3]].ptr;
    (*(pGVar1->super_RefCount)._vptr_RefCount[0x39])
              (&local_78,pGVar1,(ulong)(uint)(pPVar12->upper).field_0.m128[3]);
    auVar10._4_4_ = fStack_74;
    auVar10._0_4_ = local_78;
    auVar10._8_4_ = fStack_70;
    auVar10._12_4_ = fStack_6c;
    local_c8 = minps(local_c8,auVar10);
    local_b8 = maxps(local_b8,local_68);
    auVar19._0_4_ = local_78 + local_68._0_4_;
    auVar19._4_4_ = fStack_74 + local_68._4_4_;
    auVar19._8_4_ = fStack_70 + local_68._8_4_;
    auVar19._12_4_ = fStack_6c + local_68._12_4_;
    local_98 = minps(local_98,auVar19);
    local_88 = maxps(local_88,auVar19);
    uVar2 = *(undefined8 *)&(pPVar12->lower).field_0;
    uVar3 = *(undefined8 *)((long)&(pPVar12->lower).field_0 + 8);
    uVar4 = *(undefined8 *)&(pPVar12->upper).field_0;
    uVar5 = *(undefined8 *)((long)&(pPVar12->upper).field_0 + 8);
    uVar6 = *(undefined8 *)((long)&(pPVar11->lower).field_0 + 8);
    *(undefined8 *)&(pPVar12->lower).field_0 = *(undefined8 *)&(pPVar11->lower).field_0;
    *(undefined8 *)((long)&(pPVar12->lower).field_0 + 8) = uVar6;
    uVar6 = *(undefined8 *)((long)&(pPVar11->upper).field_0 + 8);
    *(undefined8 *)&(pPVar12->upper).field_0 = *(undefined8 *)&(pPVar11->upper).field_0;
    *(undefined8 *)((long)&(pPVar12->upper).field_0 + 8) = uVar6;
    *(undefined8 *)&(pPVar11->lower).field_0 = uVar2;
    *(undefined8 *)((long)&(pPVar11->lower).field_0 + 8) = uVar3;
    *(undefined8 *)&(pPVar11->upper).field_0 = uVar4;
    *(undefined8 *)((long)&(pPVar11->upper).field_0 + 8) = uVar5;
    pPVar12 = pPVar12 + 1;
  } while( true );
}

Assistant:

void split(const Split& split, const PrimInfoRange& set, PrimInfoRange& lset, PrimInfoRange& rset) 
      {
        if (!split.valid()) {
          deterministic_order(set);
          return splitFallback(set,lset,rset);
        }
        
        const size_t begin = set.begin();
        const size_t end   = set.end();
        CentGeomBBox3fa local_left(empty);
        CentGeomBBox3fa local_right(empty);

        auto primOnLeftSide = [&] (const PrimRef& prim) -> bool { 
          const Vec3fa axisi = normalize(direction(prim));
          const float cos0 = abs(dot(axisi,split.axis0));
          const float cos1 = abs(dot(axisi,split.axis1));
          return cos0 > cos1;
        };

        auto mergePrimBounds = [this] (CentGeomBBox3fa& pinfo,const PrimRef& ref) { 
          pinfo.extend(bounds(ref)); 
        };
        
        size_t center = serial_partitioning(prims,begin,end,local_left,local_right,primOnLeftSide,mergePrimBounds);
        
        new (&lset) PrimInfoRange(begin,center,local_left);
        new (&rset) PrimInfoRange(center,end,local_right);
        assert(area(lset.geomBounds) >= 0.0f);
        assert(area(rset.geomBounds) >= 0.0f);
      }